

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t *
Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj_00;
  int local_6c;
  int iFrame;
  int iObj;
  int Entry;
  int i;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vNewObjs;
  Vec_Int_t *vFanins_local;
  Vec_Int_t *vNodeFrames_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  iVar1 = Vec_IntSize(vNodeFrames);
  p_00 = Vec_IntAlloc(iVar1 << 1);
  iObj = 0;
  do {
    iVar1 = Vec_IntSize(vNodeFrames);
    if (iVar1 <= iObj) {
      iVar1 = Vec_IntSize(p_00);
      iVar2 = Vec_IntSize(vNodeFrames);
      if (iVar1 == iVar2 * 2) {
        return p_00;
      }
      __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                    ,0x164,
                    "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vNodeFrames,iObj);
    pObj_00 = Wlc_NtkObj(p,iVar1 >> 0xb);
    iVar1 = Wlc_ObjType(pObj_00);
    if (iVar1 == 8) {
      _Entry = Wlc_ObjFanin0(p,pObj_00);
    }
    else {
      iVar1 = Wlc_ObjType(pObj_00);
      if ((iVar1 != 0x36) && (iVar1 = Wlc_ObjType(pObj_00), iVar1 != 0x37)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                      ,0x158,
                      "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      _Entry = Wlc_ObjFanin1(p,pObj_00);
    }
    iVar1 = Wlc_NtkDupOneObject(pNew,p,_Entry,3,vFanins);
    Vec_IntPush(p_00,iVar1);
    iVar1 = Wlc_ObjType(pObj_00);
    if (iVar1 == 8) {
      _Entry = (Wlc_Obj_t *)0x0;
    }
    else {
      iVar1 = Wlc_ObjType(pObj_00);
      _Entry = pObj_00;
      if (iVar1 != 0x36) {
        iVar1 = Wlc_ObjType(pObj_00);
        if (iVar1 != 0x37) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                        ,0x161,
                        "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        _Entry = Wlc_ObjFanin2(p,pObj_00);
      }
    }
    if (_Entry == (Wlc_Obj_t *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = Wlc_NtkDupOneObject(pNew,p,_Entry,3,vFanins);
    }
    Vec_IntPush(p_00,local_6c);
    iObj = iObj + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkAbsCreateFlopOutputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins ) 
{
    Vec_Int_t * vNewObjs = Vec_IntAlloc( 2*Vec_IntSize(vNodeFrames) );
    Wlc_Obj_t * pObj, * pFanin = NULL;
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        // address
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = Wlc_ObjFanin0(p, pObj);
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin1(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) );
        // data
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = NULL;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            pFanin = pObj;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin2(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, pFanin ? Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) : 0 );
    }
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    return vNewObjs;
}